

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xchacha20.cpp
# Opt level: O3

void crypto::xchacha20::derive_subkey(char *key,char *nonce,char *subkey)

{
  word local_58 [2];
  char acStack_50 [8];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_58 = (word  [2])0x3320646e61707865;
  builtin_strncpy(acStack_50,"2-byte k",8);
  local_48 = *(undefined8 *)key;
  uStack_40 = *(undefined8 *)(key + 8);
  local_38 = *(undefined8 *)(key + 0x10);
  uStack_30 = *(undefined8 *)(key + 0x18);
  local_28 = *(undefined8 *)nonce;
  uStack_20 = *(undefined8 *)(nonce + 8);
  run_rounds(local_58);
  *(word (*) [2])subkey = local_58;
  *(char (*) [8])(subkey + 8) = acStack_50;
  *(undefined8 *)(subkey + 0x10) = local_28;
  *(undefined8 *)(subkey + 0x18) = uStack_20;
  return;
}

Assistant:

void xchacha20::derive_subkey(const char key[key_size], const char nonce[16], char subkey[key_size]) {
	
	word state[16];
	init_state(state, key);
	state[12] = util::little_endian::load<word>(nonce);
	state[13] = util::little_endian::load<word>(nonce + 4);
	state[14] = util::little_endian::load<word>(nonce + 8);
	state[15] = util::little_endian::load<word>(nonce + 12);
	run_rounds(state);
	util::little_endian::store<word>(state[0], subkey);
	util::little_endian::store<word>(state[1], subkey + 4);
	util::little_endian::store<word>(state[2], subkey + 8);
	util::little_endian::store<word>(state[3], subkey + 12);
	util::little_endian::store<word>(state[12], subkey + 16);
	util::little_endian::store<word>(state[13], subkey + 20);
	util::little_endian::store<word>(state[14], subkey + 24);
	util::little_endian::store<word>(state[15], subkey + 28);
	
}